

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void __thiscall State::apply(State *this,State *dst)

{
  Message *in_RSI;
  Message *in_RDI;
  vector<float,_std::allocator<float>_> *unaff_retaddr;
  Message *__x;
  
  if ((in_RDI->received & 1U) != 0) {
    __x = in_RDI;
    if ((in_RDI->field_0x1 & 1) != 0) {
      in_RSI->received = true;
      in_RSI->field_0x1 = 1;
      Message::operator=(in_RSI,in_RDI);
    }
    if ((in_RDI->field_0x2 & 1) != 0) {
      in_RSI->received = true;
      in_RSI->field_0x2 = 1;
      std::vector<float,_std::allocator<float>_>::operator=
                (unaff_retaddr,(vector<float,_std::allocator<float>_> *)__x);
    }
    if ((in_RDI->field_0x3 & 1) != 0) {
      in_RSI->received = true;
      in_RSI->field_0x3 = 1;
      ggvector<short>::assign((ggvector *)&in_RSI[1].protocolId);
    }
    if ((in_RDI->field_0x4 & 1) != 0) {
      in_RSI->received = true;
      in_RSI->field_0x4 = 1;
      memcpy(in_RSI + 2,in_RDI + 2,0x2c);
    }
    if ((in_RDI->field_0x5 & 1) != 0) {
      in_RSI->received = true;
      in_RSI->field_0x5 = 1;
      memcpy(&in_RSI[2].protocolId,&in_RDI[2].protocolId,0x160);
    }
    Flags::clear((Flags *)0x1823b0);
    in_RDI->received = false;
  }
  return;
}

Assistant:

void apply(State & dst) {
        if (update == false) return;

        if (this->flags.newMessage) {
            dst.update = true;
            dst.flags.newMessage = true;
            dst.message = std::move(this->message);
        }

        if (this->flags.newSpectrum) {
            dst.update = true;
            dst.flags.newSpectrum = true;
            dst.rxSpectrum = std::move(this->rxSpectrum);
        }

        if (this->flags.newTxAmplitude) {
            dst.update = true;
            dst.flags.newTxAmplitude = true;
            dst.txAmplitude.assign(this->txAmplitude);
        }

        if (this->flags.newStats) {
            dst.update = true;
            dst.flags.newStats = true;
            dst.stats = std::move(this->stats);
        }

        if (this->flags.newTxProtocols) {
            dst.update = true;
            dst.flags.newTxProtocols = true;
            dst.txProtocols = std::move(this->txProtocols);
        }

        flags.clear();
        update = false;
    }